

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

Matrix * rlGetMatrixProjection(void)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix *in_RDI;
  
  uVar2 = RLGL.State.projection._56_8_;
  fVar1 = RLGL.State.projection.m7;
  in_RDI->m3 = RLGL.State.projection.m3;
  uVar3 = RLGL.State.projection._56_8_;
  in_RDI->m7 = fVar1;
  RLGL.State.projection.m11 = (float)uVar2;
  RLGL.State.projection.m15 = SUB84(uVar2,4);
  fVar1 = RLGL.State.projection.m15;
  in_RDI->m11 = RLGL.State.projection.m11;
  RLGL.State.projection._56_8_ = uVar3;
  uVar2 = RLGL.State.projection._40_8_;
  in_RDI->m15 = fVar1;
  fVar1 = RLGL.State.projection.m6;
  in_RDI->m2 = RLGL.State.projection.m2;
  uVar3 = RLGL.State.projection._40_8_;
  in_RDI->m6 = fVar1;
  RLGL.State.projection.m10 = (float)uVar2;
  RLGL.State.projection.m14 = SUB84(uVar2,4);
  fVar1 = RLGL.State.projection.m14;
  in_RDI->m10 = RLGL.State.projection.m10;
  RLGL.State.projection._40_8_ = uVar3;
  uVar2 = RLGL.State.projection._24_8_;
  in_RDI->m14 = fVar1;
  fVar1 = RLGL.State.projection.m5;
  in_RDI->m1 = RLGL.State.projection.m1;
  uVar3 = RLGL.State.projection._24_8_;
  in_RDI->m5 = fVar1;
  RLGL.State.projection.m9 = (float)uVar2;
  RLGL.State.projection.m13 = SUB84(uVar2,4);
  fVar1 = RLGL.State.projection.m13;
  in_RDI->m9 = RLGL.State.projection.m9;
  RLGL.State.projection._24_8_ = uVar3;
  uVar2 = RLGL.State.projection._8_8_;
  in_RDI->m13 = fVar1;
  fVar1 = RLGL.State.projection.m4;
  in_RDI->m0 = RLGL.State.projection.m0;
  uVar3 = RLGL.State.projection._8_8_;
  in_RDI->m4 = fVar1;
  RLGL.State.projection.m8 = (float)uVar2;
  RLGL.State.projection.m12 = SUB84(uVar2,4);
  fVar1 = RLGL.State.projection.m12;
  in_RDI->m8 = RLGL.State.projection.m8;
  RLGL.State.projection._8_8_ = uVar3;
  in_RDI->m12 = fVar1;
  return in_RDI;
}

Assistant:

Matrix rlGetMatrixProjection(void)
{
#if defined(GRAPHICS_API_OPENGL_11)
    float mat[16];
    glGetFloatv(GL_PROJECTION_MATRIX,mat);
    Matrix m;
    m.m0 = mat[0];
    m.m1 = mat[1];
    m.m2 = mat[2];
    m.m3 = mat[3];
    m.m4 = mat[4];
    m.m5 = mat[5];
    m.m6 = mat[6];
    m.m7 = mat[7];
    m.m8 = mat[8];
    m.m9 = mat[9];
    m.m10 = mat[10];
    m.m11 = mat[11];
    m.m12 = mat[12];
    m.m13 = mat[13];
    m.m14 = mat[14];
    m.m15 = mat[15];
    return m;
#else
    return RLGL.State.projection;
#endif
}